

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O2

char * lex_token(LexerContext *lexer,char *begin,char *end,size_t begin_pos)

{
  byte bVar1;
  unsigned_long uVar2;
  Token type;
  size_t i;
  char *pcVar3;
  pair<const_char_*,_unsigned_long> *ppVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte *it;
  bool bVar8;
  pair<unsigned_long,_unsigned_long> pos;
  optional<std::pair<const_char_*,_size_t>_> local_48;
  
  it = (byte *)begin;
  while( true ) {
    if (it == (byte *)end) {
      return end;
    }
    bVar1 = *it;
    uVar6 = (ulong)bVar1;
    if (0x2c < uVar6) break;
    if ((0x130100002200U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0x22) {
        local_48.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ = true;
        pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (it + 1,end);
        if (pcVar3 != end) {
          LexerContext::add_token(lexer,String,begin_pos,(size_t)(pcVar3 + (1 - (long)begin)));
          return pcVar3 + 1;
        }
        LexerContext::error<char_const(&)[34]>
                  (lexer,begin_pos,(char (*) [34])"missing terminating \'\"\' character");
        return end;
      }
      break;
    }
    it = it + 1;
    begin_pos = begin_pos + 1;
    begin = begin + 1;
  }
  if (9 < (byte)(bVar1 - 0x30) && 1 < (byte)(bVar1 - 0x2d)) {
LAB_001b7a9c:
    lex_gettok(&local_48,(char *)it,end);
    ppVar4 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value(&local_48);
    pcVar3 = ppVar4->first;
    uVar2 = ppVar4->second;
    LexerContext::add_token(lexer,Text,begin_pos,(long)(pcVar3 + uVar2) - (long)begin);
    return pcVar3 + uVar2;
  }
  lex_gettok(&local_48,(char *)it,end);
  ppVar4 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value(&local_48);
  pcVar3 = ppVar4->first;
  uVar6 = ppVar4->second;
  if ((uVar6 < 3) || (*pcVar3 != '0')) {
    bVar8 = false;
    uVar5 = 0;
  }
  else {
    bVar8 = (pcVar3[1] & 0xdfU) == 0x58;
    uVar5 = (ulong)((uint)bVar8 * 2);
  }
  for (; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    bVar1 = pcVar3[uVar5];
    if ((byte)(bVar1 - 0x3a) < 0xf6) {
      if (bVar8) {
        if ((5 < (byte)(bVar1 + 0xbf)) &&
           ((uVar7 = bVar1 - 0x2d, 0x39 < uVar7 ||
            ((0x3f0000000000001U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) {
LAB_001b7a52:
          uVar5 = 0;
          goto LAB_001b7a54;
        }
      }
      else if (bVar1 != 0x2d) goto LAB_001b7a52;
    }
  }
  if ((((2 < uVar6) && ((lexer->program->opt).pedantic != false)) && (*pcVar3 == '0')) &&
     ((pcVar3[1] & 0xdfU) == 0x58)) {
    pos.second = uVar6;
    pos.first = begin_pos;
    LexerContext::pedantic<char_const(&)[66]>
              (lexer,pos,
               (char (*) [66])"hexadecimal integer literals are a language extension [-pedantic]");
  }
  type = Integer;
LAB_001b7a1f:
  LexerContext::add_token(lexer,type,begin_pos,uVar6);
  return pcVar3 + uVar6;
LAB_001b7a54:
  if (uVar6 == uVar5) goto LAB_001b7ae6;
  bVar1 = pcVar3[uVar5];
  if (((9 < (byte)(bVar1 - 0x30) && bVar1 != 0x2e) && (uVar5 != 0 || bVar1 != 0x2d)) &&
     ((bVar1 | 0x20) != 0x66)) {
    if (uVar5 < uVar6) goto LAB_001b7a9c;
    goto LAB_001b7ae6;
  }
  uVar5 = uVar5 + 1;
  goto LAB_001b7a54;
LAB_001b7ae6:
  type = Float;
  goto LAB_001b7a1f;
}

Assistant:

static auto lex_token(LexerContext& lexer, const char* begin, const char* end, size_t begin_pos) -> const char*
{
    while(begin != end && lex_iswhite(*begin))
        ++begin, ++begin_pos;

    if(begin == end)
        return end;

    auto have_hexadecimal_prefix = [](const std::pair<const char*, size_t>& token)
    {
        return (token.second > 2 && token.first[0] == '0' && (token.first[1] == 'x' || token.first[1] == 'X'));
    };

    auto is_integer = [&have_hexadecimal_prefix](const std::pair<const char*, size_t>& token)
    {
        bool is_hexa = have_hexadecimal_prefix(token);

        for(size_t i = (is_hexa? 2 : 0); i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(is_hexa && ((token.first[i] >= 'A' && token.first[i] <= 'F')
                    || (token.first[i] >= 'a' && token.first[i] <= 'f')))
                {
                    continue;
                }
                else if(token.first[i] == '-')
                {
                    // valid even if i != 0
                    continue;
                }
                return false;
            }
        }
        return true;
    };

    auto is_float = [](const std::pair<const char*, size_t>& token)
    {
        for(size_t i = 0; i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(token.first[i] == '.' || (token.first[i] == '-' && i == 0))
                    continue;

                if(token.first[i] == 'f' || token.first[i] == 'F')
                {
                    // valid even if not in the end of the token
                    continue;
                }

                return false;
            }
        }
        return true;
    };

    if(*begin == '"')
    {
        auto it = std::find(std::next(begin), end, '"');
        if(it == end)
        {
            lexer.error(begin_pos, "missing terminating '\"' character");
            return end;
        }
        lexer.add_token(Token::String, begin_pos, std::distance(begin, it) + 1);
        return std::next(it);
    }

    if((*begin >= '0' && *begin <= '9') || *begin == '-' || *begin == '.')
    {
        auto token = lex_gettok(begin, end).value();

        if(is_integer(token))
        {
            if(lexer.program.opt.pedantic && have_hexadecimal_prefix(token))
                lexer.pedantic({begin_pos, token.second}, "hexadecimal integer literals are a language extension [-pedantic]");

            lexer.add_token(Token::Integer, begin_pos, token.second);
            return token.first + token.second;
        }
        else if(is_float(token))
        {
            lexer.add_token(Token::Float, begin_pos, token.second);
            return token.first + token.second;
        }
    }

    auto token = lex_gettok(begin, end).value();
    auto it = token.first + token.second;
    lexer.add_token(Token::Text, begin_pos, std::distance(begin, it));
    return it;
}